

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O3

UChar * ures_getString_63(UResourceBundle *resB,int32_t *len,UErrorCode *status)

{
  UErrorCode UVar1;
  UChar *pUVar2;
  
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (resB == (UResourceBundle *)0x0) {
      UVar1 = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      pUVar2 = res_getString_63(&resB->fResData,resB->fRes,len);
      if (pUVar2 != (UChar *)0x0) {
        return pUVar2;
      }
      UVar1 = U_RESOURCE_TYPE_MISMATCH;
    }
    *status = UVar1;
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI const UChar* U_EXPORT2 ures_getString(const UResourceBundle* resB, int32_t* len, UErrorCode* status) {
    const UChar *s;
    if (status==NULL || U_FAILURE(*status)) {
        return NULL;
    }
    if(resB == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    s = res_getString(&(resB->fResData), resB->fRes, len);
    if (s == NULL) {
        *status = U_RESOURCE_TYPE_MISMATCH;
    }
    return s;
}